

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldTypes.h
# Opt level: O3

void __thiscall
FIX::DateTime::DateTime
          (DateTime *this,int year,int month,int day,int hour,int minute,int second,int millis)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  this->_vptr_DateTime = (_func_int **)&PTR__DateTime_001ea8d0;
  iVar2 = (0xe - month) / 0xc;
  iVar4 = year - iVar2;
  iVar1 = iVar4 + 0x12c0;
  iVar4 = iVar4 + 0x12c3;
  if (-1 < iVar1) {
    iVar4 = iVar1;
  }
  iVar3 = (int)((ulong)((long)iVar1 * -0x51eb851f) >> 0x20);
  this->m_date = iVar1 * 0x16d + day + (iVar4 >> 2) + ((iVar3 >> 5) - (iVar3 >> 0x1f)) + iVar1 / 400
                 + ((month + iVar2 * 0xc) * 0x99 + -0x1c9) / 5 + -0x7d2d;
  this->m_time = (long)(millis * 1000000) +
                 ((long)minute * 0x3c + (long)hour * 0xe10 + (long)second) * 1000000000;
  return;
}

Assistant:

DateTime( int year, int month, int day,
            int hour, int minute, int second, int millis ) 
  {
    m_date = julianDate( year, month, day );
    m_time = makeHMS( hour, minute, second, millis * PRECISION_FACTOR[3] );
  }